

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O0

void __thiscall
Am_Inter_Location_Data::Am_Inter_Location_Data
          (Am_Inter_Location_Data *this,Am_Inter_Location_Data *proto)

{
  Am_Inter_Location_Data *proto_local;
  Am_Inter_Location_Data *this_local;
  
  Am_Wrapper::Am_Wrapper(&this->super_Am_Wrapper);
  (this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
       (_func_int **)&PTR_ID_004102f8;
  Am_Object::Am_Object(&this->ref_obj);
  Am_Object::operator=(&this->ref_obj,&proto->ref_obj);
  this->as_line = (bool)(proto->as_line & 1);
  this->growing = (bool)(proto->growing & 1);
  this->a_control = proto->a_control;
  this->b_control = proto->b_control;
  this->c_control = proto->c_control;
  this->d_control = proto->d_control;
  *(undefined8 *)&this->data = *(undefined8 *)&proto->data;
  *(undefined8 *)((long)&this->data + 8) = *(undefined8 *)((long)&proto->data + 8);
  return;
}

Assistant:

Am_Inter_Location_Data::Am_Inter_Location_Data(Am_Inter_Location_Data *proto)
{
  ref_obj = proto->ref_obj;
  as_line = proto->as_line;
  growing = proto->growing;
  a_control = proto->a_control;
  b_control = proto->b_control;
  c_control = proto->c_control;
  d_control = proto->d_control;
  data = proto->data;
}